

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O1

FilePath *
testing::internal::FilePath::ConcatPaths
          (FilePath *__return_storage_ptr__,FilePath *directory,FilePath *relative_path)

{
  pointer pcVar1;
  long *plVar2;
  size_type *psVar3;
  __string_type __str;
  FilePath dir;
  undefined1 *local_80;
  ulong local_78;
  undefined1 local_70 [16];
  string local_60;
  FilePath local_40;
  
  if ((directory->pathname_)._M_string_length == 0) {
    (__return_storage_ptr__->pathname_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->pathname_).field_2;
    pcVar1 = (relative_path->pathname_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,
               pcVar1 + (relative_path->pathname_)._M_string_length);
  }
  else {
    RemoveTrailingPathSeparator(&local_40,directory);
    local_80 = local_70;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,local_40.pathname_._M_dataplus._M_p,
               local_40.pathname_._M_dataplus._M_p + local_40.pathname_._M_string_length);
    std::__cxx11::string::_M_replace_aux((ulong)&local_80,local_78,0,'\x01');
    plVar2 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_80,(ulong)(relative_path->pathname_)._M_dataplus._M_p
                               );
    psVar3 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar3) {
      local_60.field_2._M_allocated_capacity = *psVar3;
      local_60.field_2._8_8_ = plVar2[3];
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    }
    else {
      local_60.field_2._M_allocated_capacity = *psVar3;
      local_60._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_60._M_string_length = plVar2[1];
    *plVar2 = (long)psVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    FilePath(__return_storage_ptr__,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if (local_80 != local_70) {
      operator_delete(local_80);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40.pathname_._M_dataplus._M_p != &local_40.pathname_.field_2) {
      operator_delete(local_40.pathname_._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::ConcatPaths(const FilePath& directory,
                               const FilePath& relative_path) {
  if (directory.IsEmpty())
    return relative_path;
  const FilePath dir(directory.RemoveTrailingPathSeparator());
  return FilePath(dir.string() + kPathSeparator + relative_path.string());
}